

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void constructAutomaticIndex
               (Parse *pParse,WhereClause *pWC,SrcList_item *pSrc,Bitmask notReady,
               WhereLevel *pLevel)

{
  byte *pbVar1;
  long lVar2;
  byte bVar3;
  u8 uVar4;
  short sVar5;
  int iVar6;
  Vdbe *p;
  Table *pTVar7;
  WhereLoop *p_00;
  sqlite3 *db;
  SrcList *pSVar8;
  int *piVar9;
  bool bVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  Expr *pEVar17;
  Index *pIdx;
  CollSeq *pCVar18;
  uint uVar19;
  WhereTerm *pWVar20;
  char *pcVar21;
  Op *pOVar22;
  WhereTerm *pWVar23;
  uint uVar24;
  ulong uVar25;
  int iVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar31;
  ulong uVar30;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar36;
  ulong uVar35;
  uint uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  uint uVar42;
  uint uVar44;
  uint uVar45;
  undefined1 auVar43 [16];
  uint uVar46;
  undefined1 auVar47 [16];
  ulong uVar48;
  ulong uVar49;
  long local_c0;
  Expr *local_b8;
  char *zNotUsed;
  code *local_58;
  code *local_50;
  u8 local_3c;
  anon_union_8_14_c5524298_for_u local_38;
  
  p = pParse->pVdbe;
  iVar12 = sqlite3VdbeAddOp3(p,0x11,0,0,0);
  pTVar7 = pSrc->pTab;
  pWVar23 = pWC->a;
  pWVar20 = pWVar23 + pWC->nTerm;
  p_00 = pLevel->pWLoop;
  if ((long)pWC->nTerm < 1) {
    uVar29 = 0;
    uVar25 = 0xffffffffffffffff;
    local_b8 = (Expr *)0x0;
  }
  else {
    uVar29 = 0;
    uVar25 = 0;
    bVar10 = false;
    local_b8 = (Expr *)0x0;
    do {
      if (((p_00->prereq == 0) && ((pWVar23->wtFlags & 2) == 0)) &&
         (pEVar17 = pWVar23->pExpr, (pEVar17->flags & 1) == 0)) {
        local_38.n = pSrc->iCursor;
        local_3c = '\x03';
        local_58 = exprNodeIsConstant;
        local_50 = sqlite3SelectWalkFail;
        walkExpr((Walker *)&zNotUsed,pEVar17);
        if (local_3c != '\0') {
          db = pParse->db;
          pEVar17 = exprDup(db,pEVar17,0,(u8 **)0x0);
          local_b8 = sqlite3ExprAnd(db,local_b8,pEVar17);
        }
      }
      iVar13 = termCanDriveIndex(pWVar23,pSrc,notReady);
      if (iVar13 != 0) {
        iVar13 = (pWVar23->u).leftColumn;
        uVar27 = 1L << ((byte)iVar13 & 0x3f);
        if (0x3f < (long)iVar13) {
          uVar27 = 0x8000000000000000;
        }
        if (!bVar10) {
          sqlite3_log(0x11c,"automatic index on %s(%s)",pTVar7->zName,pTVar7->aCol[iVar13].zName);
        }
        bVar10 = true;
        if ((uVar27 & uVar25) == 0) {
          iVar13 = whereLoopResize(pParse->db,p_00,uVar29 + 1);
          if (iVar13 != 0) goto LAB_0017a87e;
          p_00->aLTerm[(int)uVar29] = pWVar23;
          uVar25 = uVar25 | uVar27;
          bVar10 = true;
          uVar29 = uVar29 + 1;
        }
      }
      pWVar23 = pWVar23 + 1;
    } while (pWVar23 < pWVar20);
    uVar25 = ~uVar25 | 0x8000000000000000;
  }
  p_00->nLTerm = (u16)uVar29;
  (p_00->u).btree.nEq = (u16)uVar29;
  p_00->wsFlags = 0x4241;
  uVar25 = uVar25 & pSrc->colUsed;
  sVar5 = pTVar7->nCol;
  uVar24 = (uint)sVar5;
  uVar19 = 0x3f;
  if (sVar5 < 0x3f) {
    uVar19 = uVar24;
  }
  if (0 < (int)uVar24) {
    uVar27 = (ulong)(uVar19 + 3 & 0x7c);
    lVar2 = (ulong)uVar19 - 1;
    auVar38._8_4_ = (int)lVar2;
    auVar38._0_8_ = lVar2;
    auVar38._12_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar41._8_4_ = (int)uVar25;
    auVar41._0_8_ = uVar25;
    auVar41._12_4_ = (int)(uVar25 >> 0x20);
    auVar43 = _DAT_00194080;
    auVar47 = _DAT_00194090;
    uVar32 = 0;
    uVar34 = 0;
    uVar37 = 0;
    do {
      uVar36 = uVar37;
      uVar33 = uVar34;
      uVar31 = uVar32;
      uVar28 = uVar29;
      auVar39 = auVar47;
      auVar40 = auVar43;
      uVar48 = 1L << auVar40._0_8_ & uVar25;
      uVar49 = 1L << auVar40._8_8_ & auVar41._8_8_;
      uVar30 = 1L << auVar39._0_8_ & uVar25;
      uVar35 = 1L << auVar39._8_8_ & auVar41._8_8_;
      uVar29 = (uVar28 - ((int)(uVar30 >> 0x20) == 0 && (int)uVar30 == 0)) + 1;
      uVar32 = (uVar31 - ((int)uVar35 == 0 && (int)(uVar35 >> 0x20) == 0)) + 1;
      uVar34 = (uVar33 - ((int)(uVar48 >> 0x20) == 0 && (int)uVar48 == 0)) + 1;
      uVar37 = (uVar36 - ((int)uVar49 == 0 && (int)(uVar49 >> 0x20) == 0)) + 1;
      auVar47._0_8_ = auVar39._0_8_ + 4;
      auVar47._8_8_ = auVar39._8_8_ + 4;
      auVar43._0_8_ = auVar40._0_8_ + 4;
      auVar43._8_8_ = auVar40._8_8_ + 4;
      uVar27 = uVar27 - 4;
    } while (uVar27 != 0);
    auVar38 = auVar38 ^ _DAT_001940a0;
    auVar39 = auVar39 ^ _DAT_001940a0;
    iVar13 = auVar38._4_4_;
    iVar14 = auVar38._12_4_;
    auVar40 = auVar40 ^ _DAT_001940a0;
    uVar42 = -(uint)(iVar13 < auVar39._4_4_ ||
                    auVar39._4_4_ == iVar13 && auVar38._0_4_ < auVar39._0_4_);
    uVar44 = -(uint)(iVar14 < auVar39._12_4_ ||
                    auVar39._12_4_ == iVar14 && auVar38._8_4_ < auVar39._8_4_);
    uVar45 = -(uint)(iVar13 < auVar40._4_4_ ||
                    auVar40._4_4_ == iVar13 && auVar38._0_4_ < auVar40._0_4_);
    uVar46 = -(uint)(iVar14 < auVar40._12_4_ ||
                    auVar40._12_4_ == iVar14 && auVar38._8_4_ < auVar40._8_4_);
    uVar29 = (~uVar46 & uVar37 | uVar36 & uVar46) + (~uVar44 & uVar32 | uVar31 & uVar44) +
             (~uVar45 & uVar34 | uVar33 & uVar45) + (~uVar42 & uVar29 | uVar28 & uVar42);
  }
  iVar13 = 1;
  if ((long)pSrc->colUsed < 0) {
    iVar13 = uVar24 - 0x3e;
  }
  uVar27 = 0;
  pIdx = sqlite3AllocateIndexObject(pParse->db,(i16)(iVar13 + uVar29),0,&zNotUsed);
  if (pIdx != (Index *)0x0) {
    (p_00->u).btree.pIndex = pIdx;
    pIdx->zName = "auto-index";
    pIdx->pTable = pTVar7;
    pWVar23 = pWC->a;
    if (pWVar23 < pWVar20) {
      uVar27 = 0;
      uVar30 = 0;
      do {
        iVar14 = termCanDriveIndex(pWVar23,pSrc,notReady);
        if (iVar14 != 0) {
          iVar14 = (pWVar23->u).leftColumn;
          uVar35 = 1L << ((byte)iVar14 & 0x3f);
          if (0x3f < iVar14) {
            uVar35 = 0x8000000000000000;
          }
          if ((uVar35 & uVar30) == 0) {
            pEVar17 = pWVar23->pExpr;
            iVar16 = (int)uVar27;
            pIdx->aiColumn[iVar16] = (i16)iVar14;
            pCVar18 = sqlite3BinaryCompareCollSeq(pParse,pEVar17->pLeft,pEVar17->pRight);
            pcVar21 = "BINARY";
            if (pCVar18 != (CollSeq *)0x0) {
              pcVar21 = pCVar18->zName;
            }
            uVar30 = uVar30 | uVar35;
            pIdx->azColl[iVar16] = pcVar21;
            uVar27 = (ulong)(iVar16 + 1);
          }
        }
        pWVar23 = pWVar23 + 1;
      } while (pWVar23 < pWVar20);
    }
    if (0 < sVar5) {
      uVar30 = 0;
      do {
        if ((uVar25 >> (uVar30 & 0x3f) & 1) != 0) {
          iVar14 = (int)uVar27;
          pIdx->aiColumn[iVar14] = (i16)uVar30;
          pIdx->azColl[iVar14] = "BINARY";
          uVar27 = (ulong)(iVar14 + 1);
        }
        uVar30 = uVar30 + 1;
      } while (uVar19 != uVar30);
    }
    if (((long)pSrc->colUsed < 0) && (0x3f < pTVar7->nCol)) {
      uVar27 = (ulong)(int)uVar27;
      iVar14 = 0x3f;
      do {
        pIdx->aiColumn[uVar27] = (i16)iVar14;
        pIdx->azColl[uVar27] = "BINARY";
        uVar27 = uVar27 + 1;
        iVar14 = iVar14 + 1;
      } while (iVar14 < pTVar7->nCol);
    }
    iVar26 = (int)uVar27;
    pIdx->aiColumn[iVar26] = -1;
    pIdx->azColl[iVar26] = "BINARY";
    iVar14 = pParse->nTab;
    pParse->nTab = iVar14 + 1;
    pLevel->iIdxCur = iVar14;
    iVar16 = 0;
    sqlite3VdbeAddOp3(p,0x70,iVar14,iVar13 + uVar29,0);
    sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
    pSVar8 = pWC->pWInfo->pTabList;
    bVar3 = pLevel->iFrom;
    if ((pSVar8->a[bVar3].fg.field_0x1 & 0x10) == 0) {
      iVar13 = pLevel->iTabCur;
      iVar14 = 0x24;
    }
    else {
      iVar13 = pSVar8->a[bVar3].regReturn;
      iVar16 = sqlite3VdbeAddOp3(p,0x46,0,0,0);
      sqlite3VdbeAddOp3(p,0xd,iVar13,0,pSVar8->a[bVar3].addrFillSub);
      iVar14 = 0xe;
    }
    iVar13 = sqlite3VdbeAddOp3(p,iVar14,iVar13,0,0);
    if (local_b8 == (Expr *)0x0) {
      local_c0 = -1;
    }
    else {
      uVar29 = sqlite3VdbeMakeLabel((Vdbe *)p->pParse);
      sqlite3ExprIfFalse(pParse,local_b8,uVar29,0x10);
      pbVar1 = (byte *)((long)&p_00->wsFlags + 2);
      *pbVar1 = *pbVar1 | 2;
      local_c0 = (long)(int)~uVar29;
    }
    if (pParse->nTempReg == '\0') {
      iVar14 = pParse->nMem + 1;
      pParse->nMem = iVar14;
    }
    else {
      bVar11 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar11;
      iVar14 = pParse->aTempReg[bVar11];
    }
    iVar15 = sqlite3GenerateIndexKey(pParse,pIdx,pLevel->iTabCur,iVar14,0,(int *)0x0,(Index *)0x0,0)
    ;
    sqlite3VdbeAddOp3(p,0x85,pLevel->iIdxCur,iVar14,0);
    iVar6 = p->nOp;
    if (0 < (long)iVar6) {
      p->aOp[(long)iVar6 + -1].p5 = 0x10;
    }
    if ((local_b8 != (Expr *)0x0) && (piVar9 = p->pParse->aLabel, piVar9 != (int *)0x0)) {
      piVar9[local_c0] = iVar6;
    }
    if ((pSVar8->a[bVar3].fg.field_0x1 & 0x10) == 0) {
      sqlite3VdbeAddOp3(p,5,pLevel->iTabCur,iVar13 + 1,0);
    }
    else {
      if (iVar16 < 0) {
        iVar16 = p->nOp + -1;
      }
      if (p->db->mallocFailed == '\0') {
        pOVar22 = p->aOp + iVar16;
      }
      else {
        pOVar22 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar22->p2 = iVar15 + iVar26;
      translateColumnToCopy(pParse,iVar13,pLevel->iTabCur,pSVar8->a[bVar3].regResult,1);
      sqlite3VdbeAddOp3(p,0xb,0,iVar13,0);
    }
    iVar16 = p->nOp;
    if (0 < (long)iVar16) {
      p->aOp[(long)iVar16 + -1].p5 = 3;
    }
    uVar4 = p->db->mallocFailed;
    if (uVar4 == '\0') {
      iVar26 = iVar16 + -1;
      if (-1 < iVar13) {
        iVar26 = iVar13;
      }
      pOVar22 = p->aOp + iVar26;
    }
    else {
      pOVar22 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar22->p2 = iVar16;
    if (iVar14 != 0) {
      bVar3 = pParse->nTempReg;
      if ((ulong)bVar3 < 8) {
        pParse->nTempReg = bVar3 + 1;
        pParse->aTempReg[bVar3] = iVar14;
        iVar16 = p->nOp;
      }
    }
    if (uVar4 == '\0') {
      iVar13 = iVar16 + -1;
      if (-1 < iVar12) {
        iVar13 = iVar12;
      }
      pOVar22 = p->aOp + iVar13;
    }
    else {
      pOVar22 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar22->p2 = iVar16;
  }
LAB_0017a87e:
  if (local_b8 != (Expr *)0x0) {
    sqlite3ExprDeleteNN(pParse->db,local_b8);
  }
  return;
}

Assistant:

static void constructAutomaticIndex(
  Parse *pParse,              /* The parsing context */
  WhereClause *pWC,           /* The WHERE clause */
  struct SrcList_item *pSrc,  /* The FROM clause term to get the next index */
  Bitmask notReady,           /* Mask of cursors that are not available */
  WhereLevel *pLevel          /* Write new index here */
){
  int nKeyCol;                /* Number of columns in the constructed index */
  WhereTerm *pTerm;           /* A single term of the WHERE clause */
  WhereTerm *pWCEnd;          /* End of pWC->a[] */
  Index *pIdx;                /* Object describing the transient index */
  Vdbe *v;                    /* Prepared statement under construction */
  int addrInit;               /* Address of the initialization bypass jump */
  Table *pTable;              /* The table being indexed */
  int addrTop;                /* Top of the index fill loop */
  int regRecord;              /* Register holding an index record */
  int n;                      /* Column counter */
  int i;                      /* Loop counter */
  int mxBitCol;               /* Maximum column in pSrc->colUsed */
  CollSeq *pColl;             /* Collating sequence to on a column */
  WhereLoop *pLoop;           /* The Loop object */
  char *zNotUsed;             /* Extra space on the end of pIdx */
  Bitmask idxCols;            /* Bitmap of columns used for indexing */
  Bitmask extraCols;          /* Bitmap of additional columns */
  u8 sentWarning = 0;         /* True if a warnning has been issued */
  Expr *pPartial = 0;         /* Partial Index Expression */
  int iContinue = 0;          /* Jump here to skip excluded rows */
  struct SrcList_item *pTabItem;  /* FROM clause term being indexed */
  int addrCounter = 0;        /* Address where integer counter is initialized */
  int regBase;                /* Array of registers where record is assembled */

  /* Generate code to skip over the creation and initialization of the
  ** transient index on 2nd and subsequent iterations of the loop. */
  v = pParse->pVdbe;
  assert( v!=0 );
  addrInit = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);

  /* Count the number of columns that will be added to the index
  ** and used to match WHERE clause constraints */
  nKeyCol = 0;
  pTable = pSrc->pTab;
  pWCEnd = &pWC->a[pWC->nTerm];
  pLoop = pLevel->pWLoop;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    Expr *pExpr = pTerm->pExpr;
    assert( !ExprHasProperty(pExpr, EP_FromJoin)    /* prereq always non-zero */
         || pExpr->iRightJoinTable!=pSrc->iCursor   /*   for the right-hand   */
         || pLoop->prereq!=0 );                     /*   table of a LEFT JOIN */
    if( pLoop->prereq==0
     && (pTerm->wtFlags & TERM_VIRTUAL)==0
     && !ExprHasProperty(pExpr, EP_FromJoin)
     && sqlite3ExprIsTableConstant(pExpr, pSrc->iCursor) ){
      pPartial = sqlite3ExprAnd(pParse->db, pPartial,
                                sqlite3ExprDup(pParse->db, pExpr, 0));
    }
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol = pTerm->u.leftColumn;
      Bitmask cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS );
      testcase( iCol==BMS-1 );
      if( !sentWarning ){
        sqlite3_log(SQLITE_WARNING_AUTOINDEX,
            "automatic index on %s(%s)", pTable->zName,
            pTable->aCol[iCol].zName);
        sentWarning = 1;
      }
      if( (idxCols & cMask)==0 ){
        if( whereLoopResize(pParse->db, pLoop, nKeyCol+1) ){
          goto end_auto_index_create;
        }
        pLoop->aLTerm[nKeyCol++] = pTerm;
        idxCols |= cMask;
      }
    }
  }
  assert( nKeyCol>0 );
  pLoop->u.btree.nEq = pLoop->nLTerm = nKeyCol;
  pLoop->wsFlags = WHERE_COLUMN_EQ | WHERE_IDX_ONLY | WHERE_INDEXED
                     | WHERE_AUTO_INDEX;

  /* Count the number of additional columns needed to create a
  ** covering index.  A "covering index" is an index that contains all
  ** columns that are needed by the query.  With a covering index, the
  ** original table never needs to be accessed.  Automatic indices must
  ** be a covering index because the index will not be updated if the
  ** original table changes and the index and table cannot both be used
  ** if they go out of sync.
  */
  extraCols = pSrc->colUsed & (~idxCols | MASKBIT(BMS-1));
  mxBitCol = MIN(BMS-1,pTable->nCol);
  testcase( pTable->nCol==BMS-1 );
  testcase( pTable->nCol==BMS-2 );
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ) nKeyCol++;
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    nKeyCol += pTable->nCol - BMS + 1;
  }

  /* Construct the Index object to describe this index */
  pIdx = sqlite3AllocateIndexObject(pParse->db, nKeyCol+1, 0, &zNotUsed);
  if( pIdx==0 ) goto end_auto_index_create;
  pLoop->u.btree.pIndex = pIdx;
  pIdx->zName = "auto-index";
  pIdx->pTable = pTable;
  n = 0;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol = pTerm->u.leftColumn;
      Bitmask cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS-1 );
      testcase( iCol==BMS );
      if( (idxCols & cMask)==0 ){
        Expr *pX = pTerm->pExpr;
        idxCols |= cMask;
        pIdx->aiColumn[n] = pTerm->u.leftColumn;
        pColl = sqlite3BinaryCompareCollSeq(pParse, pX->pLeft, pX->pRight);
        pIdx->azColl[n] = pColl ? pColl->zName : sqlite3StrBINARY;
        n++;
      }
    }
  }
  assert( (u32)n==pLoop->u.btree.nEq );

  /* Add additional columns needed to make the automatic index into
  ** a covering index */
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    for(i=BMS-1; i<pTable->nCol; i++){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  assert( n==nKeyCol );
  pIdx->aiColumn[n] = XN_ROWID;
  pIdx->azColl[n] = sqlite3StrBINARY;

  /* Create the automatic index */
  assert( pLevel->iIdxCur>=0 );
  pLevel->iIdxCur = pParse->nTab++;
  sqlite3VdbeAddOp2(v, OP_OpenAutoindex, pLevel->iIdxCur, nKeyCol+1);
  sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
  VdbeComment((v, "for %s", pTable->zName));

  /* Fill the automatic index with content */
  pTabItem = &pWC->pWInfo->pTabList->a[pLevel->iFrom];
  if( pTabItem->fg.viaCoroutine ){
    int regYield = pTabItem->regReturn;
    addrCounter = sqlite3VdbeAddOp2(v, OP_Integer, 0, 0);
    sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, pTabItem->addrFillSub);
    addrTop =  sqlite3VdbeAddOp1(v, OP_Yield, regYield);
    VdbeCoverage(v);
    VdbeComment((v, "next row of %s", pTabItem->pTab->zName));
  }else{
    addrTop = sqlite3VdbeAddOp1(v, OP_Rewind, pLevel->iTabCur); VdbeCoverage(v);
  }
  if( pPartial ){
    iContinue = sqlite3VdbeMakeLabel(v);
    sqlite3ExprIfFalse(pParse, pPartial, iContinue, SQLITE_JUMPIFNULL);
    pLoop->wsFlags |= WHERE_PARTIALIDX;
  }
  regRecord = sqlite3GetTempReg(pParse);
  regBase = sqlite3GenerateIndexKey(
      pParse, pIdx, pLevel->iTabCur, regRecord, 0, 0, 0, 0
  );
  sqlite3VdbeAddOp2(v, OP_IdxInsert, pLevel->iIdxCur, regRecord);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  if( pPartial ) sqlite3VdbeResolveLabel(v, iContinue);
  if( pTabItem->fg.viaCoroutine ){
    sqlite3VdbeChangeP2(v, addrCounter, regBase+n);
    testcase( pParse->db->mallocFailed );
    translateColumnToCopy(pParse, addrTop, pLevel->iTabCur,
                          pTabItem->regResult, 1);
    sqlite3VdbeGoto(v, addrTop);
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, pLevel->iTabCur, addrTop+1); VdbeCoverage(v);
  }
  sqlite3VdbeChangeP5(v, SQLITE_STMTSTATUS_AUTOINDEX);
  sqlite3VdbeJumpHere(v, addrTop);
  sqlite3ReleaseTempReg(pParse, regRecord);
  
  /* Jump here when skipping the initialization */
  sqlite3VdbeJumpHere(v, addrInit);

end_auto_index_create:
  sqlite3ExprDelete(pParse->db, pPartial);
}